

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aecm_core.cc
# Opt level: O0

void WebRtcAecm_CalcEnergies
               (AecmCore *aecm,uint16_t *far_spectrum,int16_t far_q,uint32_t nearEner,
               int32_t *echoEst)

{
  uint16_t uVar1;
  int16_t local_42;
  int16_t local_40;
  int16_t local_3c;
  int16_t decrease_min_shifts;
  int16_t increase_min_shifts;
  int16_t decrease_max_shifts;
  int16_t increase_max_shifts;
  int16_t tmp16;
  int i;
  uint32_t tmpFar;
  uint32_t tmpStored;
  uint32_t tmpAdapt;
  int32_t *echoEst_local;
  uint32_t nearEner_local;
  int16_t far_q_local;
  uint16_t *far_spectrum_local;
  AecmCore *aecm_local;
  
  tmpFar = 0;
  i = 0;
  _increase_max_shifts = 0;
  local_3c = 4;
  local_40 = 0xb;
  local_42 = 3;
  _tmpStored = echoEst;
  echoEst_local._0_4_ = nearEner;
  echoEst_local._6_2_ = far_q;
  _nearEner_local = far_spectrum;
  far_spectrum_local = (uint16_t *)aecm;
  memmove(aecm->nearLogEnergy + 1,aecm->nearLogEnergy,0x7e);
  uVar1 = LogOfEnergyInQ8((uint32_t)echoEst_local,(int)(short)far_spectrum_local[0x1b5e]);
  far_spectrum_local[0x1b60] = uVar1;
  (*WebRtcAecm_CalcLinearEnergies)
            ((AecmCore *)far_spectrum_local,_nearEner_local,_tmpStored,
             (uint32_t *)&increase_max_shifts,&tmpFar,(uint32_t *)&i);
  memmove(far_spectrum_local + 0x1ba2,far_spectrum_local + 0x1ba1,0x7e);
  memmove(far_spectrum_local + 0x1be2,far_spectrum_local + 0x1be1,0x7e);
  uVar1 = LogOfEnergyInQ8(_increase_max_shifts,(int)echoEst_local._6_2_);
  far_spectrum_local[0x1ba0] = uVar1;
  uVar1 = LogOfEnergyInQ8(tmpFar,echoEst_local._6_2_ + 0xc);
  far_spectrum_local[0x1ba1] = uVar1;
  uVar1 = LogOfEnergyInQ8(i,echoEst_local._6_2_ + 0xc);
  far_spectrum_local[0x1be1] = uVar1;
  if (0x401 < (short)far_spectrum_local[0x1ba0]) {
    if (far_spectrum_local[0x21b7] == 0) {
      local_3c = 2;
      local_42 = 2;
      local_40 = 8;
    }
    uVar1 = WebRtcAecm_AsymFilt(far_spectrum_local[0x21ae],far_spectrum_local[0x1ba0],local_40,
                                local_42);
    far_spectrum_local[0x21ae] = uVar1;
    uVar1 = WebRtcAecm_AsymFilt(far_spectrum_local[0x21af],far_spectrum_local[0x1ba0],local_3c,0xb);
    far_spectrum_local[0x21af] = uVar1;
    far_spectrum_local[0x21b0] = far_spectrum_local[0x21af] - far_spectrum_local[0x21ae];
    if ((short)(0xa00 - far_spectrum_local[0x21ae]) < 1) {
      decrease_min_shifts = 0;
    }
    else {
      decrease_min_shifts = (int16_t)((short)(0xa00 - far_spectrum_local[0x21ae]) * 0xe6 >> 9);
    }
    if (far_spectrum_local[0x21b7] == 0 || 0x400 < (short)far_spectrum_local[0x21b6]) {
      far_spectrum_local[0x21b1] = far_spectrum_local[0x21ae] + decrease_min_shifts + 0xe6;
    }
    else if ((short)far_spectrum_local[0x1ba0] < (short)far_spectrum_local[0x21b1]) {
      far_spectrum_local[0x21b1] =
           far_spectrum_local[0x21b1] +
           (short)(((int)(short)far_spectrum_local[0x1ba0] +
                   (int)(short)(decrease_min_shifts + 0xe6)) -
                   (int)(short)far_spectrum_local[0x21b1] >> 6);
      far_spectrum_local[0x21b6] = 0;
    }
    else {
      far_spectrum_local[0x21b6] = far_spectrum_local[0x21b6] + 1;
    }
    far_spectrum_local[0x21b2] = far_spectrum_local[0x21b1] + 0x100;
  }
  if ((short)far_spectrum_local[0x21b1] < (short)far_spectrum_local[0x1ba0]) {
    if (far_spectrum_local[0x21b7] == 0 || 0x3a1 < (short)far_spectrum_local[0x21b0]) {
      far_spectrum_local[0x21b4] = 1;
      far_spectrum_local[0x21b5] = 0;
    }
  }
  else {
    far_spectrum_local[0x21b4] = 0;
    far_spectrum_local[0x21b5] = 0;
  }
  if (((*(int *)(far_spectrum_local + 0x21b4) != 0) && (*(int *)(far_spectrum_local + 8) != 0)) &&
     (far_spectrum_local[8] = 0, far_spectrum_local[9] = 0,
     (short)far_spectrum_local[0x1b60] < (short)far_spectrum_local[0x1ba1])) {
    for (_increase_min_shifts = 0; _increase_min_shifts < 0x41;
        _increase_min_shifts = _increase_min_shifts + 1) {
      *(short *)(*(long *)(far_spectrum_local + 0x1f44) + (long)_increase_min_shifts * 2) =
           *(short *)(*(long *)(far_spectrum_local + 0x1f44) + (long)_increase_min_shifts * 2) >> 3;
    }
    far_spectrum_local[0x1ba1] = far_spectrum_local[0x1ba1] - 0x300;
    far_spectrum_local[8] = 1;
    far_spectrum_local[9] = 0;
  }
  return;
}

Assistant:

void WebRtcAecm_CalcEnergies(AecmCore* aecm,
                             const uint16_t* far_spectrum,
                             const int16_t far_q,
                             const uint32_t nearEner,
                             int32_t* echoEst) {
    // Local variables
    uint32_t tmpAdapt = 0;
    uint32_t tmpStored = 0;
    uint32_t tmpFar = 0;

    int i;

    int16_t tmp16;
    int16_t increase_max_shifts = 4;
    int16_t decrease_max_shifts = 11;
    int16_t increase_min_shifts = 11;
    int16_t decrease_min_shifts = 3;

    // Get log of near end energy and store in buffer

    // Shift buffer
    memmove(aecm->nearLogEnergy + 1, aecm->nearLogEnergy,
            sizeof(int16_t) * (MAX_BUF_LEN - 1));

    // Logarithm of integrated magnitude spectrum (nearEner)
    aecm->nearLogEnergy[0] = LogOfEnergyInQ8(nearEner, aecm->dfaNoisyQDomain);

    WebRtcAecm_CalcLinearEnergies(aecm, far_spectrum, echoEst, &tmpFar, &tmpAdapt, &tmpStored);

    // Shift buffers
    memmove(aecm->echoAdaptLogEnergy + 1, aecm->echoAdaptLogEnergy,
            sizeof(int16_t) * (MAX_BUF_LEN - 1));
    memmove(aecm->echoStoredLogEnergy + 1, aecm->echoStoredLogEnergy,
            sizeof(int16_t) * (MAX_BUF_LEN - 1));

    // Logarithm of delayed far end energy
    aecm->farLogEnergy = LogOfEnergyInQ8(tmpFar, far_q);

    // Logarithm of estimated echo energy through adapted channel
    aecm->echoAdaptLogEnergy[0] = LogOfEnergyInQ8(tmpAdapt,
                                                  RESOLUTION_CHANNEL16 + far_q);

    // Logarithm of estimated echo energy through stored channel
    aecm->echoStoredLogEnergy[0] =
        LogOfEnergyInQ8(tmpStored, RESOLUTION_CHANNEL16 + far_q);

    // Update farend energy levels (min, max, vad, mse)
    if (aecm->farLogEnergy > FAR_ENERGY_MIN)
    {
        if (aecm->startupState == 0)
        {
            increase_max_shifts = 2;
            decrease_min_shifts = 2;
            increase_min_shifts = 8;
        }

        aecm->farEnergyMin = WebRtcAecm_AsymFilt(aecm->farEnergyMin, aecm->farLogEnergy,
                                                 increase_min_shifts, decrease_min_shifts);
        aecm->farEnergyMax = WebRtcAecm_AsymFilt(aecm->farEnergyMax, aecm->farLogEnergy,
                                                 increase_max_shifts, decrease_max_shifts);
        aecm->farEnergyMaxMin = (aecm->farEnergyMax - aecm->farEnergyMin);

        // Dynamic VAD region size
        tmp16 = 2560 - aecm->farEnergyMin;
        if (tmp16 > 0)
        {
          tmp16 = (int16_t)((tmp16 * FAR_ENERGY_VAD_REGION) >> 9);
        } else
        {
            tmp16 = 0;
        }
        tmp16 += FAR_ENERGY_VAD_REGION;

        if ((aecm->startupState == 0) | (aecm->vadUpdateCount > 1024))
        {
            // In startup phase or VAD update halted
            aecm->farEnergyVAD = aecm->farEnergyMin + tmp16;
        } else
        {
            if (aecm->farEnergyVAD > aecm->farLogEnergy)
            {
                aecm->farEnergyVAD +=
                    (aecm->farLogEnergy + tmp16 - aecm->farEnergyVAD) >> 6;
                aecm->vadUpdateCount = 0;
            } else
            {
                aecm->vadUpdateCount++;
            }
        }
        // Put MSE threshold higher than VAD
        aecm->farEnergyMSE = aecm->farEnergyVAD + (1 << 8);
    }

    // Update VAD variables
    if (aecm->farLogEnergy > aecm->farEnergyVAD)
    {
        if ((aecm->startupState == 0) | (aecm->farEnergyMaxMin > FAR_ENERGY_DIFF))
        {
            // We are in startup or have significant dynamics in input speech level
            aecm->currentVADValue = 1;
        }
    } else
    {
        aecm->currentVADValue = 0;
    }
    if ((aecm->currentVADValue) && (aecm->firstVAD))
    {
        aecm->firstVAD = 0;
        if (aecm->echoAdaptLogEnergy[0] > aecm->nearLogEnergy[0])
        {
            // The estimated echo has higher energy than the near end signal.
            // This means that the initialization was too aggressive. Scale
            // down by a factor 8
            for (i = 0; i < PART_LEN1; i++)
            {
                aecm->channelAdapt16[i] >>= 3;
            }
            // Compensate the adapted echo energy level accordingly.
            aecm->echoAdaptLogEnergy[0] -= (3 << 8);
            aecm->firstVAD = 1;
        }
    }
}